

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_set_tagsize(mcbsp_size_t *size)

{
  bool bVar1;
  size_t sVar2;
  mcbsp_size_t *size_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");
  }
  if (size == (mcbsp_size_t *)0x0) {
    bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");
  }
  sVar2 = bsplib::Bsmp::set_tag_size(s_bsmp,*size);
  *size = sVar2;
  return;
}

Assistant:

void mcbsp_set_tagsize( mcbsp_size_t * size )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");

    if (size == NULL)
        bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");

    *size = s_bsmp->set_tag_size( *size );
}